

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_prefix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos82;
  int yypos82;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yy_AND(G);
  if ((iVar4 == 0) || (iVar4 = yy_action(G), iVar4 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar4 = yy_AND(G);
    if ((iVar4 == 0) || (iVar4 = yy_suffix(G), iVar4 == 0)) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar4 = yy_NOT(G);
      if ((iVar4 == 0) || (iVar4 = yy_suffix(G), iVar4 == 0)) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar5 = yy_suffix(G);
        if (iVar5 == 0) {
          G->pos = iVar1;
          G->thunkpos = iVar2;
          return 0;
        }
      }
      else {
        yyDo(G,yy_3_prefix,G->begin,G->end,"yy_3_prefix");
      }
    }
    else {
      yyDo(G,yy_2_prefix,G->begin,G->end,"yy_2_prefix");
    }
  }
  else {
    yyDo(G,yy_1_prefix,G->begin,G->end,"yy_1_prefix");
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_prefix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "prefix"));

  {  int yypos82= G->pos, yythunkpos82= G->thunkpos;  if (!yy_AND(G))  goto l83;
  if (!yy_action(G))  goto l83;
  yyDo(G, yy_1_prefix, G->begin, G->end, "yy_1_prefix");
  goto l82;
  l83:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_AND(G))  goto l84;
  if (!yy_suffix(G))  goto l84;
  yyDo(G, yy_2_prefix, G->begin, G->end, "yy_2_prefix");
  goto l82;
  l84:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_NOT(G))  goto l85;
  if (!yy_suffix(G))  goto l85;
  yyDo(G, yy_3_prefix, G->begin, G->end, "yy_3_prefix");
  goto l82;
  l85:;	  G->pos= yypos82; G->thunkpos= yythunkpos82;  if (!yy_suffix(G))  goto l81;

  }
  l82:;	  yyprintf((stderr, "  ok   prefix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l81:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "prefix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}